

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O0

bool __thiscall iDynTree::URDFDocument::documentHasBeenParsed(URDFDocument *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  size_type sVar6;
  ostream *poVar7;
  reference pvVar8;
  char *pcVar9;
  Model *model;
  long in_RDI;
  string baseLinkName;
  Model normalizedModel;
  Model newModel;
  size_t root;
  stringstream ss;
  string linkName;
  uint link;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rootCandidates;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childLinks;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff7e8;
  value_type *in_stack_fffffffffffff7f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff850;
  string local_740 [32];
  Model local_720 [152];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
  *in_stack_fffffffffffff978;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
  *in_stack_fffffffffffff980;
  Model *in_stack_fffffffffffff988;
  Model local_5f0 [304];
  Model local_4c0 [24];
  Model *in_stack_fffffffffffffb58;
  ModelSolidShapes *in_stack_fffffffffffffb90;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
  *in_stack_fffffffffffffb98;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>_>_>_>
  *in_stack_fffffffffffffba0;
  Model *in_stack_fffffffffffffba8;
  string local_390 [32];
  ulong local_370;
  stringstream local_368 [16];
  ostream local_358 [380];
  undefined4 local_1dc;
  Model local_1d8 [304];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  string local_98 [52];
  uint local_64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [3];
  byte local_1;
  
  processJoints(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x192f09);
  for (local_64 = 0; uVar4 = (ulong)local_64, uVar5 = iDynTree::Model::getNrOfLinks(), uVar4 < uVar5
      ; local_64 = local_64 + 1) {
    iDynTree::Model::getLinkName_abi_cxx11_((long)local_98);
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(in_stack_fffffffffffff7e8,(key_type *)0x192f90);
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffff7e8);
    bVar1 = std::__detail::operator==(&local_a0,&local_a8);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    }
    std::__cxx11::string::~string(local_98);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffff800);
  if (bVar1) {
    iDynTree::reportError("RobotElement","exitElementScope","No root link found in URDF string");
    iDynTree::Model::Model(local_1d8);
    iDynTree::Model::operator=((Model *)(in_RDI + 0x10),local_1d8);
    iDynTree::Model::~Model(local_1d8);
    local_1 = 0;
    local_1dc = 1;
  }
  else {
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_60);
    if (sVar6 < 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_60,0);
      iDynTree::Model::getLinkIndex((string *)(in_RDI + 0x10));
      iDynTree::Model::setDefaultBaseLink(in_RDI + 0x10);
      iDynTree::Model::Model(local_5f0);
      iDynTree::Model::Model(local_720);
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)local_5f0);
      model = (Model *)iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)local_720);
      bVar2 = iDynTree::removeFakeLinks((Model *)(in_RDI + 0x10),local_5f0);
      if ((bVar2 & 1) == 0) {
        iDynTree::reportError
                  ("URDFDocument","documentHasBeenParsed",
                   "Failed to remove fake links from the model");
        local_1 = 0;
        local_1dc = 1;
      }
      else {
        iDynTree::Model::getDefaultBaseLink();
        iDynTree::Model::getLinkName_abi_cxx11_((long)local_740);
        bVar3 = iDynTree::createModelWithNormalizedJointNumbering(local_5f0,local_740,local_720);
        if ((bVar3 & 1) == 0) {
          iDynTree::reportError
                    ("URDFDocument","documentHasBeenParsed",
                     "Failed to remove fake links from the model");
          local_1 = 0;
        }
        else {
          iDynTree::Model::operator=((Model *)(in_RDI + 0x10),local_720);
          bVar1 = processSensors(model,(vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                                        *)CONCAT17(bVar2,in_stack_fffffffffffff850));
          if (bVar1) {
            if (((*(byte *)(in_RDI + 0x140) & 1) == 0) ||
               (bVar1 = addSensorFramesAsAdditionalFramesToModel(in_stack_fffffffffffffb58), bVar1))
            {
              iDynTree::Model::visualSolidShapes();
              bVar1 = addVisualPropertiesToModel
                                (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                                 in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
              if (!bVar1) {
                iDynTree::reportError
                          ("URDFDocument","documentHasBeenParsed",
                           "Failed to add visual elements to model");
              }
              in_stack_fffffffffffff800 =
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x260);
              iDynTree::Model::collisionSolidShapes();
              bVar1 = addVisualPropertiesToModel
                                (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                                 in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
              if (!bVar1) {
                iDynTree::reportError
                          ("URDFDocument","documentHasBeenParsed",
                           "Failed to add collision elements to model");
              }
              local_1 = 1;
            }
            else {
              local_1 = 0;
            }
          }
          else {
            local_1 = 0;
          }
        }
        local_1dc = 1;
        std::__cxx11::string::~string(local_740);
      }
      iDynTree::Model::~Model(local_720);
      iDynTree::Model::~Model(local_5f0);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_368);
      poVar7 = std::operator<<(local_358,"Multiple (");
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_60);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar6);
      std::operator<<(poVar7,") root links: (");
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_60,0);
      std::operator<<(local_358,(string *)pvVar8);
      for (local_370 = 1; uVar4 = local_370,
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_60), uVar4 < sVar6; local_370 = local_370 + 1) {
        poVar7 = std::operator<<(local_358,", ");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_60,local_370);
        std::operator<<(poVar7,(string *)pvVar8);
      }
      std::operator<<(local_358,") found in URDF string");
      std::__cxx11::stringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("RobotElement","exitElementScope",pcVar9);
      std::__cxx11::string::~string(local_390);
      iDynTree::Model::Model(local_4c0);
      iDynTree::Model::operator=((Model *)(in_RDI + 0x10),local_4c0);
      iDynTree::Model::~Model(local_4c0);
      local_1 = 0;
      local_1dc = 1;
      std::__cxx11::stringstream::~stringstream(local_368);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffff800);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1937a3);
  return (bool)(local_1 & 1);
}

Assistant:

bool URDFDocument::documentHasBeenParsed()
    {
        // Maybe it is not the cleanest solution to process the model here,
        // but the after the scope is exited, the Model should be fully formed.
        // Add the joints to the model
        std::unordered_set<std::string> childLinks = processJoints(m_model,
                                                                   m_buffers.joints,
                                                                   m_buffers.fixedJoints);
        // Get root
        std::vector<std::string> rootCandidates;
        for(unsigned link = 0; link < m_model.getNrOfLinks(); ++link)
        {
            std::string linkName = m_model.getLinkName(link);
            if (childLinks.find(linkName) == childLinks.end() )
            {
                rootCandidates.push_back(linkName);
            }
        }

        if (rootCandidates.empty()) {
            reportError("RobotElement", "exitElementScope", "No root link found in URDF string");
            m_model = Model();
            return false;
        }

        if (rootCandidates.size() >= 2) {
            std::stringstream ss;
            ss << "Multiple (" << rootCandidates.size() << ") root links: (";
            ss << rootCandidates[0];
            for (size_t root = 1; root < rootCandidates.size(); ++root)
            {
                ss << ", " << rootCandidates[root];
            }
            ss << ") found in URDF string";

            reportError("RobotElement", "exitElementScope", ss.str().c_str());
            m_model = Model();
            return false;
        }

        // set the default root in the model
        m_model.setDefaultBaseLink(m_model.getLinkIndex(rootCandidates[0]));
        iDynTree::Model newModel, normalizedModel;
        newModel.setPackageDirs(m_model.getPackageDirs());
        normalizedModel.setPackageDirs(m_model.getPackageDirs());

        if (!removeFakeLinks(m_model, newModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        std::string baseLinkName = newModel.getLinkName(newModel.getDefaultBaseLink());
        if (!createModelWithNormalizedJointNumbering(newModel, baseLinkName, normalizedModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        m_model = normalizedModel;

        if (!processSensors(m_model, m_buffers.sensorHelpers))
        {
            //TODO: error
            return false;
        }

        if (m_options.addSensorFramesAsAdditionalFrames)
        {
            if (!addSensorFramesAsAdditionalFramesToModel(m_model)) {
                //TODO: error
                return false;
            }
        }

        // Assign visual properties to objects
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.visuals,
                                        m_buffers.materials,
                                        m_model.visualSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add visual elements to model");
        }
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.collisions,
                                        m_buffers.materials,
                                        m_model.collisionSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add collision elements to model");
        }

        return true;
    }